

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cb_explore_adf.cc
# Opt level: O2

void CB_EXPLORE_ADF::do_sort(cb_explore_adf *data)

{
  action_score *__first;
  action_score *__last;
  long lVar1;
  ulong uVar2;
  cb_explore_adf *this;
  action_score *__i;
  action_score *__last_00;
  cb_explore_adf local_1500;
  cb_explore_adf local_12b0;
  cb_explore_adf local_1060;
  cb_explore_adf local_e10;
  cb_explore_adf local_bc0;
  cb_explore_adf local_970;
  cb_explore_adf local_720;
  cb_explore_adf local_4d0;
  cb_explore_adf local_280;
  
  __first = (data->action_probs)._begin;
  __last = (data->action_probs)._end;
  cb_explore_adf::cb_explore_adf(&local_bc0,data);
  cb_explore_adf::cb_explore_adf(&local_1060,&local_bc0);
  cb_explore_adf::cb_explore_adf(&local_e10,&local_1060);
  cb_explore_adf::cb_explore_adf(&local_1500,&local_e10);
  cb_explore_adf::~cb_explore_adf(&local_e10);
  if (__first != __last) {
    cb_explore_adf::cb_explore_adf(&local_970,&local_1500);
    uVar2 = (long)__last - (long)__first >> 3;
    lVar1 = 0x3f;
    if (uVar2 != 0) {
      for (; uVar2 >> lVar1 == 0; lVar1 = lVar1 + -1) {
      }
    }
    std::
    __introsort_loop<ACTION_SCORE::action_score*,long,__gnu_cxx::__ops::_Iter_comp_iter<CB_EXPLORE_ADF::do_sort(CB_EXPLORE_ADF::cb_explore_adf&)::__0>>
              (__first,__last,(ulong)(((uint)lVar1 ^ 0x3f) * 2) ^ 0x7e,
               (_Iter_comp_iter<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_kumpera[P]vowpal_wabbit_vowpalwabbit_cb_explore_adf_cc:368:60)>
                *)&local_970);
    cb_explore_adf::~cb_explore_adf(&local_970);
    cb_explore_adf::cb_explore_adf(&local_12b0,&local_1500);
    if ((long)__last - (long)__first < 0x81) {
      this = &local_e10;
      cb_explore_adf::cb_explore_adf(this,&local_12b0);
      std::
      __insertion_sort<ACTION_SCORE::action_score*,__gnu_cxx::__ops::_Iter_comp_iter<CB_EXPLORE_ADF::do_sort(CB_EXPLORE_ADF::cb_explore_adf&)::__0>>
                (__first,__last,
                 (_Iter_comp_iter<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_kumpera[P]vowpal_wabbit_vowpalwabbit_cb_explore_adf_cc:368:60)>
                  *)this);
    }
    else {
      cb_explore_adf::cb_explore_adf(&local_4d0,&local_12b0);
      __last_00 = __first + 0x10;
      std::
      __insertion_sort<ACTION_SCORE::action_score*,__gnu_cxx::__ops::_Iter_comp_iter<CB_EXPLORE_ADF::do_sort(CB_EXPLORE_ADF::cb_explore_adf&)::__0>>
                (__first,__last_00,
                 (_Iter_comp_iter<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_kumpera[P]vowpal_wabbit_vowpalwabbit_cb_explore_adf_cc:368:60)>
                  *)&local_4d0);
      cb_explore_adf::~cb_explore_adf(&local_4d0);
      cb_explore_adf::cb_explore_adf(&local_720,&local_12b0);
      for (; __last_00 != __last; __last_00 = __last_00 + 1) {
        cb_explore_adf::cb_explore_adf(&local_280,&local_720);
        cb_explore_adf::cb_explore_adf(&local_e10,&local_280);
        std::
        __unguarded_linear_insert<ACTION_SCORE::action_score*,__gnu_cxx::__ops::_Val_comp_iter<CB_EXPLORE_ADF::do_sort(CB_EXPLORE_ADF::cb_explore_adf&)::__0>>
                  (__last_00,
                   (_Val_comp_iter<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_kumpera[P]vowpal_wabbit_vowpalwabbit_cb_explore_adf_cc:368:60)>
                    *)&local_e10);
        cb_explore_adf::~cb_explore_adf(&local_e10);
        cb_explore_adf::~cb_explore_adf(&local_280);
      }
      this = &local_720;
    }
    cb_explore_adf::~cb_explore_adf(this);
    cb_explore_adf::~cb_explore_adf(&local_12b0);
  }
  cb_explore_adf::~cb_explore_adf(&local_1500);
  cb_explore_adf::~cb_explore_adf(&local_1060);
  cb_explore_adf::~cb_explore_adf(&local_bc0);
  return;
}

Assistant:

void do_sort(cb_explore_adf& data)
{
  // We want to preserve the score order in the returned action_probs if possible.  To do this,
  // sort top_actions and data.action_probs by the order induced in data.scores.
  sort(data.action_probs.begin(), data.action_probs.end(), [data](action_score as1, action_score as2) {
    if (as1.score > as2.score)
      return true;
    else if (as1.score < as2.score)
      return false;
    // equal probabilities
    if (data.scores[as1.action] < data.scores[as2.action])
      return true;
    else if (data.scores[as1.action] > data.scores[as2.action])
      return false;
    // equal probabilities and equal cost estimates
    return as1.action < as2.action;
  });
}